

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_edg_t_bounding_sphere2(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *center,REF_DBL *radius)

{
  uint uVar1;
  REF_INT sens;
  REF_DBL t1;
  REF_DBL t0;
  REF_INT local_3c;
  double local_38;
  double local_30;
  
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,1,&local_30,&local_3c);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&local_38,&local_3c);
    if (uVar1 == 0) {
      *center = (local_30 + local_38) * 0.5;
      *radius = 0.0;
      local_30 = local_30 - *center;
      if (local_30 <= -local_30) {
        local_30 = -local_30;
      }
      *radius = local_30;
      local_38 = local_38 - *center;
      if (local_38 <= -local_38) {
        local_38 = -local_38;
      }
      if (local_30 <= local_38) {
        local_30 = local_38;
      }
      *radius = local_30;
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf9b,
             "ref_geom_edg_t_bounding_sphere2",(ulong)uVar1,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf99,
           "ref_geom_edg_t_bounding_sphere2",(ulong)uVar1,"uv0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edg_t_bounding_sphere2(REF_GEOM ref_geom,
                                                   REF_INT *nodes,
                                                   REF_DBL *center,
                                                   REF_DBL *radius) {
  REF_DBL t0, t1;
  REF_INT sens;

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &t0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &t1, &sens),
      "uv1");

  *center = (t0 + t1) * 0.5;

  *radius = 0.0;
  *radius = MAX(*radius, ABS(t0 - (*center)));
  *radius = MAX(*radius, ABS(t1 - (*center)));

  return REF_SUCCESS;
}